

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O0

int SUNLinSolSetup_Dense(SUNLinearSolver S,SUNMatrix A)

{
  sunindextype *p;
  SUNMatrix_ID SVar1;
  sunindextype sVar2;
  sunindextype n;
  SUNMatrix A_00;
  long in_RSI;
  long *in_RDI;
  sunindextype *pivots;
  realtype **A_cols;
  SUNMatrix in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  if ((in_RSI == 0) || (in_RDI == (long *)0x0)) {
    local_4 = -0x321;
  }
  else {
    SVar1 = SUNMatGetID((SUNMatrix)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (SVar1 == SUNMATRIX_DENSE) {
      A_00 = (SUNMatrix)SUNDenseMatrix_Cols(in_stack_ffffffffffffffc8);
      p = *(sunindextype **)(*in_RDI + 8);
      if ((A_00 == (SUNMatrix)0x0) || (p == (sunindextype *)0x0)) {
        *(undefined4 *)(*in_RDI + 0x10) = 0xfffffcdd;
        local_4 = -0x323;
      }
      else {
        sVar2 = SUNDenseMatrix_Rows(A_00);
        n = SUNDenseMatrix_Columns(A_00);
        sVar2 = SUNDlsMat_denseGETRF((realtype **)A_00,sVar2,n,p);
        *(sunindextype *)(*in_RDI + 0x10) = sVar2;
        if (*(int *)(*in_RDI + 0x10) < 1) {
          local_4 = 0;
        }
        else {
          local_4 = 0x328;
        }
      }
    }
    else {
      *(undefined4 *)(*in_RDI + 0x10) = 0xfffffcde;
      local_4 = -0x322;
    }
  }
  return local_4;
}

Assistant:

int SUNLinSolSetup_Dense(SUNLinearSolver S, SUNMatrix A)
{
  realtype **A_cols;
  sunindextype *pivots;

  /* check for valid inputs */
  if ( (A == NULL) || (S == NULL) )
    return(SUNLS_MEM_NULL);

  /* Ensure that A is a dense matrix */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE) {
    LASTFLAG(S) = SUNLS_ILL_INPUT;
    return(SUNLS_ILL_INPUT);
  }

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  pivots = NULL;
  A_cols = SUNDenseMatrix_Cols(A);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(SUNLS_MEM_FAIL);
  }

  /* perform LU factorization of input matrix */
  LASTFLAG(S) = SUNDlsMat_denseGETRF(A_cols, SUNDenseMatrix_Rows(A),
                                     SUNDenseMatrix_Columns(A), pivots);

  /* store error flag (if nonzero, this row encountered zero-valued pivod) */
  if (LASTFLAG(S) > 0)
    return(SUNLS_LUFACT_FAIL);
  return(SUNLS_SUCCESS);
}